

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O2

int Minisat::parseInt<Minisat::StreamBuffer>(StreamBuffer *in)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  skipWhitespace<Minisat::StreamBuffer>(in);
  if (in->pos < in->size) {
    if (in->buf[in->pos] == '-') {
      bVar1 = true;
    }
    else {
      if (in->buf[in->pos] != '+') goto LAB_00107665;
      bVar1 = false;
    }
    StreamBuffer::operator++(in);
  }
  else {
LAB_00107665:
    bVar1 = false;
  }
  iVar2 = in->pos;
  iVar3 = in->size;
  if (iVar2 < iVar3) {
    uVar4 = (ulong)in->buf[iVar2];
    if (0xf5 < (byte)(in->buf[iVar2] - 0x3a)) {
      iVar5 = 0;
      while ((iVar2 < iVar3 && ((byte)(in->buf[iVar2] - 0x30) < 10))) {
        iVar5 = iVar5 * 10 + (uint)in->buf[iVar2] + -0x30;
        StreamBuffer::operator++(in);
        iVar2 = in->pos;
        iVar3 = in->size;
      }
      iVar2 = -iVar5;
      if (!bVar1) {
        iVar2 = iVar5;
      }
      return iVar2;
    }
  }
  else {
    uVar4 = 0xffffffffffffffff;
  }
  fprintf(_stderr,"PARSE ERROR! Unexpected char: %c\n",uVar4);
  exit(3);
}

Assistant:

static int parseInt(B &in)
{
    int val = 0;
    bool neg = false;
    skipWhitespace(in);
    if (*in == '-')
        neg = true, ++in;
    else if (*in == '+')
        ++in;
    if (*in < '0' || *in > '9') fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", *in), exit(3);
    while (*in >= '0' && *in <= '9') val = val * 10 + (*in - '0'), ++in;
    return neg ? -val : val;
}